

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O1

void parse_array_should_parse_arrays_with_multiple_elements(void)

{
  cJSON *pcVar1;
  ulong uVar2;
  ulong expected;
  int *piVar3;
  
  assert_parse_array("[1\t,\n2, 3]");
  if (item[0].child == (cJSON *)0x0) {
    UnityFail("Item doesn\'t have a child.",0x6b);
  }
  if ((item[0].child)->next == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x6c);
  }
  if ((item[0].child)->next->next == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x6d);
  }
  if ((item[0].child)->next->next->next != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x6e);
  }
  UnityAssertBits(0xff,8,(long)(item[0].child)->type,"Item doesn\'t have expected type.",0x6f);
  UnityAssertBits(0xff,8,(long)(item[0].child)->next->type,"Item doesn\'t have expected type.",0x70)
  ;
  UnityAssertBits(0xff,8,(long)(item[0].child)->next->next->type,"Item doesn\'t have expected type."
                  ,0x71);
  reset(item);
  assert_parse_array("[1, null, true, false, [], \"hello\", {}]");
  if (item[0].child == (cJSON *)0x0) {
    expected = 0;
  }
  else {
    piVar3 = &DAT_001090a0;
    pcVar1 = item[0].child;
    uVar2 = 0;
    do {
      UnityAssertBits(0xff,(long)*piVar3,(long)pcVar1->type,(char *)0x0,0x8a);
      expected = uVar2 + 1;
      if (5 < uVar2) break;
      pcVar1 = pcVar1->next;
      piVar3 = piVar3 + 1;
      uVar2 = expected;
    } while (pcVar1 != (cJSON *)0x0);
  }
  UnityAssertEqualNumber(expected,7,(char *)0x0,0x8c,UNITY_DISPLAY_STYLE_INT);
  reset(item);
  return;
}

Assistant:

static void parse_array_should_parse_arrays_with_multiple_elements(void)
{
    assert_parse_array("[1\t,\n2, 3]");
    assert_has_child(item);
    TEST_ASSERT_NOT_NULL(item->child->next);
    TEST_ASSERT_NOT_NULL(item->child->next->next);
    TEST_ASSERT_NULL(item->child->next->next->next);
    assert_has_type(item->child, cJSON_Number);
    assert_has_type(item->child->next, cJSON_Number);
    assert_has_type(item->child->next->next, cJSON_Number);
    reset(item);

    {
        size_t i = 0;
        cJSON *node = NULL;
        int expected_types[7] =
        {
            cJSON_Number,
            cJSON_NULL,
            cJSON_True,
            cJSON_False,
            cJSON_Array,
            cJSON_String,
            cJSON_Object
        };
        assert_parse_array("[1, null, true, false, [], \"hello\", {}]");

        node = item->child;
        for (
                i = 0;
                (i < (sizeof(expected_types)/sizeof(int)))
                && (node != NULL);
                (void)i++, node = node->next)
        {
            TEST_ASSERT_BITS(0xFF, expected_types[i], node->type);
        }
        TEST_ASSERT_EQUAL_INT(i, 7);
        reset(item);
    }
}